

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_parallel.h
# Opt level: O0

void __thiscall
agge::renderer_parallel::operator()
          (renderer_parallel *this,bitmap<unsigned_short,_0UL,_0UL> *bitmap_,vector_i offset,
          rect_i *window,mask_full<8UL> *mask,
          thread_mapping_blender<unsigned_short,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  kernel_function local_a0;
  kernel_function kernel;
  undefined1 local_70 [8];
  rendition_adapter adapter;
  thread_mapping_blender<unsigned_short,_unsigned_char> *blender_local;
  mask_full<8UL> *mask_local;
  rect_i *window_local;
  bitmap<unsigned_short,_0UL,_0UL> *bitmap__local;
  renderer_parallel *this_local;
  vector_i offset_local;
  
  kernel.alpha = (simple_alpha<unsigned_char,_8UL> *)offset;
  adapter._48_8_ = blender;
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>_>
  ::adapter((adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>_>
             *)local_70,bitmap_,offset,window,blender);
  operator()<agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>,agge::tests::mocks::
  mask_full<8ul>,agge::tests::mocks::thread_mapping_blender<unsigned_short,unsigned_char>,agge::
  tests::mocks::simple_alpha<unsigned_char,8ul>>(agge::tests::mocks::
  bitmap<unsigned_short,0ul,0ul>&,agge::agge_vector<int>,agge::rect<int>const*,agge::tests::mocks::
  mask_full<8ul>const&,agge::tests::mocks::
  thread_mapping_blender<unsigned_short,unsigned_char>const&,agge::tests::mocks::
  simple_alpha<unsigned_char,8ul>const&)::kernel_function::kernel_function(agge::renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>,agge::tests::mocks::
  thread_mapping_blender<unsigned_short,unsigned_char>>const&,agge::renderer_parallel_const&,agge::
  tests::mocks::mask_full<8ul>const&,agge::tests::mocks::simple_alpha<unsigned_char,8ul>_const__
            (&local_a0,(rendition_adapter *)local_70,this,mask,alpha);
  parallel::call(&this->_parallel,&local_a0);
  return;
}

Assistant:

void renderer_parallel::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window,
		const MaskT &mask, const BlenderT &blender, const AlphaFn &alpha)
	{
		typedef renderer::adapter<BitmapT, BlenderT> rendition_adapter;

		struct kernel_function : parallel::kernel_function, noncopyable
		{
			kernel_function(const rendition_adapter &adapter_, const renderer_parallel &renderer_, const MaskT &mask_,
					const AlphaFn &alpha_)
				: adapter(adapter_), renderer(renderer_), mask(mask_), alpha(alpha_)
			{	}

			virtual void operator ()(count_t threadid)
			{
				rendition_adapter ra_thread(adapter);
				scanline_adapter<rendition_adapter> sl(ra_thread, renderer._scanline_caches[threadid], mask.width());

				render(sl, mask, alpha, threadid, renderer._parallelism);
			}

			const rendition_adapter &adapter;
			const renderer_parallel &renderer;
			const MaskT &mask;
			const AlphaFn &alpha;
		};

		const rendition_adapter adapter(bitmap_, offset, window, blender);
		kernel_function kernel(adapter, *this, mask, alpha);

		_parallel.call(kernel);
	}